

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall soul::heart::Block::Block(Block *this,Identifier nm)

{
  string *psVar1;
  char *pcVar2;
  Block *this_local;
  Identifier nm_local;
  
  this_local = (Block *)nm.name;
  Object::Object(&this->super_Object);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Block_0058ad98;
  (this->name).name = (string *)this_local;
  std::
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  ::vector(&this->parameters);
  LinkedList<soul::heart::Statement>::LinkedList(&this->statements);
  pool_ptr<soul::heart::Terminator>::pool_ptr(&this->terminator);
  std::
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>::
  vector(&this->predecessors);
  this->doNotOptimiseAway = false;
  psVar1 = Identifier::toString_abi_cxx11_((Identifier *)&this_local);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
  checkAssertion(*pcVar2 == '@',"nm.toString()[0] == \'@\'","Block",0x401);
  return;
}

Assistant:

Block (Identifier nm) : name (nm)  { SOUL_ASSERT (nm.toString()[0] == '@'); }